

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O2

void __thiscall TNT::i_refvec<interval>::i_refvec(i_refvec<interval> *this,int n)

{
  interval *piVar1;
  int *piVar2;
  long lVar3;
  
  this->data_ = (interval *)0x0;
  this->ref_count_ = (int *)0x0;
  if (0 < n) {
    piVar1 = (interval *)operator_new__((ulong)(uint)n * 0x18);
    lVar3 = 0;
    do {
      interval::interval((interval *)((long)&piVar1->inf + lVar3));
      lVar3 = lVar3 + 0x18;
    } while ((ulong)(uint)n * 0x18 - lVar3 != 0);
    this->data_ = piVar1;
    piVar2 = (int *)operator_new(4);
    this->ref_count_ = piVar2;
    *piVar2 = 1;
  }
  return;
}

Assistant:

i_refvec<T>::i_refvec(int n) : data_(NULL), ref_count_(NULL)
{
	if (n >= 1)
	{
#ifdef TNT_DEBUG
		std::cout  << "new data storage.\n";
#endif
		data_ = new T[n];
		ref_count_ = new int;
		*ref_count_ = 1;
	}
}